

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# question_6.cpp
# Opt level: O1

int main(void)

{
  undefined8 in_RAX;
  ulong uVar1;
  long *plVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  int *piVar8;
  int n;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  std::istream::operator>>((istream *)&std::cin,(int *)((long)&uStack_38 + 4));
  if (0 < uStack_38._4_4_) {
    lVar6 = 0;
    piVar8 = num;
    do {
      std::istream::operator>>((istream *)&std::cin,piVar8);
      lVar6 = lVar6 + 1;
      piVar8 = piVar8 + 1;
    } while (lVar6 < uStack_38._4_4_);
  }
  if (uStack_38._4_4_ != 0) {
    uVar1 = (ulong)uStack_38._4_4_;
    lVar6 = 0x3f;
    if (uVar1 != 0) {
      for (; uVar1 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::__introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (num,num + uVar1,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(num,num + uVar1);
  }
  lVar6 = (long)uStack_38._4_4_;
  if (lVar6 < 1) {
    uVar7 = 0;
  }
  else {
    lVar4 = 0;
    uVar7 = 0;
    do {
      if ((lVar4 != 0) && (num[lVar4] != (&DAT_0010408c)[lVar4])) {
        lVar5 = (long)(int)uVar7;
        uVar7 = uVar7 + 1;
        ans[lVar5] = (&DAT_0010408c)[lVar4];
      }
      lVar4 = lVar4 + 1;
    } while (lVar6 != lVar4);
  }
  ans[(int)uVar7] = (&DAT_0010408c)[lVar6];
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,uVar7 + 1);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  if (-1 < (int)uVar7) {
    lVar6 = 0;
    do {
      poVar3 = (ostream *)
               std::ostream::operator<<((ostream *)&std::cout,*(int *)((long)ans + lVar6));
      if ((ulong)uVar7 << 2 != lVar6) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      }
      lVar6 = lVar6 + 4;
    } while ((ulong)uVar7 * 4 + 4 != lVar6);
  }
  return 0;
}

Assistant:

int main()
{
    int n,m;
    cin >> n;
    for (int i = 0; i < n; ++i) {
        cin  >> num[i];
    }
    sort(num,num + n);
    m = 0;
    for (int j = 0; j < n; ++j) {
        if(j != 0 && num[j] != num[j-1] )
        ans[m++] = num[j-1];
    }
    ans[m++]  = num[n-1];
    cout << m <<endl;
    for (int k = 0; k < m; ++k) {
        if(k != m-1)
            cout << ans[k] << " ";
        else
            cout << ans[k];
    }
    return 0;
}